

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O3

int nni_id_alloc32(nni_id_map *m,uint32_t *idp,void *val)

{
  int iVar1;
  ulong in_RAX;
  ulong local_28;
  uint64_t id;
  
  local_28 = in_RAX;
  iVar1 = nni_id_alloc(m,&local_28,val);
  if (local_28 >> 0x20 != 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/idhash.c",
              0x16e,"id < (1ULL << 32)");
  }
  *idp = (uint32_t)local_28;
  return iVar1;
}

Assistant:

int
nni_id_alloc32(nni_id_map *m, uint32_t *idp, void *val)
{
	uint64_t id;
	int      rv;
	rv = nni_id_alloc(m, &id, val);
	NNI_ASSERT(id < (1ULL << 32));
	*idp = (uint32_t) id;
	return (rv);
}